

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_reservoir_sample.cpp
# Opt level: O1

SinkResultType __thiscall
duckdb::PhysicalReservoirSample::Sink
          (PhysicalReservoirSample *this,ExecutionContext *context,DataChunk *chunk,
          OperatorSinkInput *input)

{
  __pthread_list_t *this_00;
  GlobalSinkState *pGVar1;
  __pthread_internal_list *p_Var2;
  int iVar3;
  pointer pBVar4;
  Allocator *allocator;
  pointer pSVar5;
  idx_t iVar6;
  ReservoirSamplePercentage *this_01;
  uint64_t sample_count;
  SinkResultType SVar7;
  unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true> *this_02;
  double percentage;
  
  pGVar1 = input->global_state;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)(pGVar1 + 1));
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  this_00 = &pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list;
  if (pGVar1[1].super_StateWithBlockableTasks.lock.super___mutex_base._M_mutex.__data.__list.__prev
      == (__pthread_internal_list *)0x0) {
    allocator = Allocator::Get(context->client);
    this_02 = &this->options;
    pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
             operator->(this_02);
    if (pSVar5->is_percentage == true) {
      pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
               operator->(this_02);
      percentage = Value::GetValue<double>(&pSVar5->sample_size);
      if ((percentage == 0.0) && (!NAN(percentage))) {
LAB_016b4301:
        SVar7 = FINISHED;
        goto LAB_016b4200;
      }
      pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
               operator->(this_02);
      iVar6 = optional_idx::GetIndex(&pSVar5->seed);
      this_01 = (ReservoirSamplePercentage *)operator_new(0x60);
      ReservoirSamplePercentage::ReservoirSamplePercentage(this_01,allocator,percentage,iVar6);
    }
    else {
      pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
               operator->(this_02);
      sample_count = Value::GetValue<unsigned_long>(&pSVar5->sample_size);
      if (sample_count == 0) goto LAB_016b4301;
      pSVar5 = unique_ptr<duckdb::SampleOptions,_std::default_delete<duckdb::SampleOptions>,_true>::
               operator->(this_02);
      iVar6 = optional_idx::GetIndex(&pSVar5->seed);
      this_01 = (ReservoirSamplePercentage *)operator_new(0x58);
      ReservoirSample::ReservoirSample((ReservoirSample *)this_01,allocator,sample_count,iVar6);
    }
    p_Var2 = this_00->__prev;
    this_00->__prev = (__pthread_internal_list *)this_01;
    if (p_Var2 != (__pthread_internal_list *)0x0) {
      (*(code *)p_Var2->__prev->__next)();
    }
  }
  pBVar4 = unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>::
           operator->((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)this_00);
  (*pBVar4->_vptr_BlockingSample[2])(pBVar4,chunk);
  SVar7 = NEED_MORE_INPUT;
LAB_016b4200:
  pthread_mutex_unlock((pthread_mutex_t *)(pGVar1 + 1));
  return SVar7;
}

Assistant:

SinkResultType PhysicalReservoirSample::Sink(ExecutionContext &context, DataChunk &chunk,
                                             OperatorSinkInput &input) const {
	auto &global_state = input.global_state.Cast<SampleGlobalSinkState>();
	// Percentage only has a global sample.
	lock_guard<mutex> glock(global_state.lock);
	if (!global_state.sample) {
		// always gather full thread percentage
		auto &allocator = Allocator::Get(context.client);
		if (options->is_percentage) {
			double percentage = options->sample_size.GetValue<double>();
			if (percentage == 0) {
				return SinkResultType::FINISHED;
			}
			global_state.sample = make_uniq<ReservoirSamplePercentage>(allocator, percentage,
			                                                           static_cast<int64_t>(options->seed.GetIndex()));
		} else {
			idx_t num_samples = options->sample_size.GetValue<idx_t>();
			if (num_samples == 0) {
				return SinkResultType::FINISHED;
			}
			global_state.sample =
			    make_uniq<ReservoirSample>(allocator, num_samples, static_cast<int64_t>(options->seed.GetIndex()));
		}
	}
	global_state.sample->AddToReservoir(chunk);
	return SinkResultType::NEED_MORE_INPUT;
}